

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManFlowUpdateCut(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  void *pvVar3;
  int iVar4;
  void *Entry;
  
  Aig_ManIncrementTravId(p);
  for (iVar4 = 0; iVar4 < vMinCut->nSize; iVar4 = iVar4 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vMinCut,iVar4);
    Llb_ManFlowLabelTfi_rec(p,pObj);
  }
  vMinCut->nSize = 0;
  Aig_ManIncrementTravId(p);
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(p->vObjs,iVar4);
    if ((pvVar3 != (void *)0x0) &&
       ((uVar2 = (uint)*(undefined8 *)((long)pvVar3 + 0x18), (uVar2 & 7) == 3 ||
        (0xfffffffd < (uVar2 & 7) - 7)))) {
      iVar1 = p->nTravIds;
      if ((*(int *)((long)pvVar3 + 0x20) != iVar1) && (*(int *)((long)pvVar3 + 0x20) != iVar1 + -1))
      {
        Entry = (void *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe);
        if (*(int *)((long)Entry + 0x20) == iVar1 + -1) {
          *(int *)((long)Entry + 0x20) = iVar1;
          Vec_PtrPush(vMinCut,Entry);
          uVar2 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        }
        if (0xfffffffd < (uVar2 & 7) - 7) {
          pvVar3 = (void *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe);
          if (*(int *)((long)pvVar3 + 0x20) == p->nTravIds + -1) {
            *(int *)((long)pvVar3 + 0x20) = p->nTravIds;
            Vec_PtrPush(vMinCut,pvVar3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Llb_ManFlowUpdateCut( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i;
    // label the TFI of the cut nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        Llb_ManFlowLabelTfi_rec( p, pObj );
    // collect labeled fanins of non-labeled nodes
    Vec_PtrClear( vMinCut );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCo(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) || Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin0(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin0(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin0(pObj) );
        }
        if ( Aig_ObjIsNode(pObj) && Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin1(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin1(pObj) );
        }
    }
}